

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O2

void __thiscall
Win32MakefileGenerator::writeObjectsPart(Win32MakefileGenerator *this,QTextStream *t)

{
  QMakeProject *this_00;
  QTextStream *pQVar1;
  ProStringList *paths;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_90 [2];
  QArrayDataPointer<ProString> local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QTextStream *)QTextStream::operator<<(t,"OBJECTS       = ");
  this_00 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)local_90,"OBJECTS");
  paths = QMakeEvaluator::valuesRef(&this_00->super_QMakeEvaluator,(ProKey *)local_90);
  MakefileGenerator::escapeDependencyPaths
            ((ProStringList *)&local_60,&this->super_MakefileGenerator,paths);
  MakefileGenerator::valList
            ((QString *)&local_48,&this->super_MakefileGenerator,(ProStringList *)&local_60);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,(QString *)&local_48);
  Qt::endl(pQVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Win32MakefileGenerator::writeObjectsPart(QTextStream &t)
{
    // Used in both deps and commands.
    t << "OBJECTS       = " << valList(escapeDependencyPaths(project->values("OBJECTS"))) << Qt::endl;
}